

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall OpenMD::AngleR::processHistogram(AngleR *this)

{
  double dVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  long in_RDI;
  uint i;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd70));
    if (sVar3 <= local_c) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(ulong)local_c);
    if (*pvVar4 < 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd88),(ulong)local_c
                         );
      *pvVar5 = 0.0;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd70),(ulong)local_c
                         );
      dVar1 = *pvVar5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(ulong)local_c);
      iVar2 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd88),(ulong)local_c
                         );
      *pvVar5 = dVar1 / (double)iVar2 + *pvVar5;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr," count = ");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xda0),(ulong)local_c);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar4);
    poVar6 = std::operator<<(poVar6," avgAngle = ");
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd88),(ulong)local_c);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
    std::operator<<(poVar6,"\n");
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void AngleR::processHistogram() {
    for (unsigned int i = 0; i < histogram_.size(); ++i) {
      if (count_[i] > 0)
        avgAngleR_[i] += histogram_[i] / count_[i];
      else
        avgAngleR_[i] = 0.0;

      std::cerr << " count = " << count_[i] << " avgAngle = " << avgAngleR_[i]
                << "\n";
    }
  }